

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blanczos.cpp
# Opt level: O2

uint32_t blanczos(uint32_t *B,uint64_t N,uint32_t Nrow,uint32_t Ncol,uint64_t *result)

{
  byte *pbVar1;
  ulong *puVar2;
  long *plVar3;
  uchar uVar4;
  undefined1 uVar5;
  unsigned_long uVar6;
  pointer puVar7;
  uint32_t bit;
  int iVar8;
  uint32_t nthreads;
  uint uVar9;
  result_type rVar10;
  ulong uVar11;
  ostream *poVar12;
  ulong uVar13;
  uint *puVar14;
  ulong uVar15;
  pointer puVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  uint64_t uVar23;
  ulong uVar24;
  vec64 *pvVar25;
  uint uVar26;
  pointer puVar27;
  uint32_t vec_2;
  long lVar28;
  long lVar29;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *p_Var30;
  ulong uVar31;
  uint64_t *elem;
  pointer puVar32;
  size_type __n;
  bool bVar33;
  undefined1 auVar34 [16];
  allocator_type local_32a1;
  vec64 work1;
  vec64 AV0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vectors;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_3258;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_3238;
  value_type_conflict2 local_3220;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_3218;
  vec64 X;
  vector<unsigned_char,_std::allocator<unsigned_char>_> solution;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_31c8;
  vec64 Q;
  vec64 result_1;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_3160;
  vec64 work2;
  uniform_int_distribution<unsigned_long> dis;
  vec64 workV;
  sparse matrix;
  array<unsigned_int,_64UL> temp;
  arr64 D;
  arr64 W0i;
  arr64 T0;
  arr64 E;
  arr64 T1;
  arr64 F;
  arr64 G;
  arr64 W1i;
  arr64 W2i;
  random_device rd;
  mt19937_64 gen;
  
  iVar8 = std::thread::hardware_concurrency();
  nthreads = iVar8 + (uint)(iVar8 == 0);
  if (Ncol < Nrow + 0x40) {
    poVar12 = std::operator<<((ostream *)&std::cerr,"Ncol >= Nrow + 64 is expected.");
    std::endl<char,std::char_traits<char>>(poVar12);
    iVar8 = 0x11;
LAB_0010791b:
    exit(iVar8);
  }
  __blanczos_matrix::sparse::sparse(&matrix,B,N,Nrow,Ncol,524288.0);
  uVar9 = 0xffffffff;
LAB_001069e8:
  if (uVar9 != 0xffffffff) {
    __blanczos_matrix::sparse::~sparse(&matrix);
    return uVar9;
  }
  std::random_device::random_device(&rd);
  uVar9 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&gen,(ulong)uVar9);
  dis._M_param._M_a = 0;
  dis._M_param._M_b = 0xffffffffffffffff;
  T0._M_elems[0] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &X.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,
             (ulong)matrix.Kcols,T0._M_elems,(allocator_type *)&T1);
  puVar16 = X.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (puVar32 = X.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start; puVar32 != puVar16; puVar32 = puVar32 + 1) {
    rVar10 = std::uniform_int_distribution<unsigned_long>::operator()(&dis,&gen);
    *puVar32 = rVar10;
  }
  __n = (long)X.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)X.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3;
  if (__n == matrix.Kcols) {
    uVar11 = (ulong)matrix.Ncols;
    uVar17 = (ulong)matrix.Krows;
    T0._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&Q,__n,T0._M_elems,(allocator_type *)&T1);
    T0._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_31c8,__n,T0._M_elems,
               (allocator_type *)&T1);
    T0._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3258,__n,T0._M_elems,
               (allocator_type *)&T1);
    T0._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3218,__n,T0._M_elems,
               (allocator_type *)&T1);
    T0._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&AV0,__n,T0._M_elems,(allocator_type *)&T1);
    T0._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3238,__n,T0._M_elems,
               (allocator_type *)&T1);
    T0._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&workV,__n,T0._M_elems,(allocator_type *)&T1);
    T0._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&work1,uVar17,T0._M_elems,(allocator_type *)&T1);
    T0._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&work2,uVar17,T0._M_elems,(allocator_type *)&T1);
    memset(&T0,0,0x200);
    memset((allocator_type *)&T1,0,0x200);
    memset(&W0i,0,0x200);
    memset(&W1i,0,0x200);
    memset(&W2i,0,0x200);
    memset(&G,0,0x200);
    memset(&F,0,0x200);
    memset(&E,0,0x200);
    memset(&D,0,0x200);
    auVar34 = ZEXT816(0) << 0x40;
    temp._M_elems._192_32_ = ZEXT1632(auVar34);
    temp._M_elems._64_32_ = ZEXT1632(auVar34);
    temp._M_elems._0_32_ = ZEXT1632(auVar34);
    temp._M_elems._32_32_ = temp._M_elems._0_32_;
    temp._M_elems._96_32_ = temp._M_elems._64_32_;
    temp._M_elems._128_32_ = temp._M_elems._64_32_;
    temp._M_elems._160_32_ = temp._M_elems._64_32_;
    temp._M_elems._224_32_ = temp._M_elems._192_32_;
    __blanczos_matrix::sparse::multiply_regular
              (&matrix,&work1,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &X.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,nthreads);
    __blanczos_matrix::sparse::multiply_transpose(&matrix,&Q,&work1,nthreads);
    if ((long)Q.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)Q.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      memmove(local_31c8._M_impl.super__Vector_impl_data._M_start,
              Q.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start,
              (long)Q.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)Q.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
    }
    __blanczos_matrix::sparse::multiply_regular
              (&matrix,&work1,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_31c8,
               nthreads);
    __blanczos_matrix::sparse::multiply_transpose(&matrix,&AV0,&work1,nthreads);
    anon_unknown.dwarf_9997::dot((vec64 *)&local_31c8,&AV0,&T0);
    uVar17 = 0xffffffffffffffff;
LAB_00106d72:
    lVar18 = 0;
LAB_00106d74:
    if (lVar18 != 0x200) goto code_r0x00106d80;
    __blanczos_matrix::sparse::multiply_regular
              (&matrix,&work1,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &X.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,nthreads);
    __blanczos_matrix::sparse::multiply_regular
              (&matrix,&work2,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_31c8,
               nthreads);
    uVar15 = (long)work1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)work1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    uVar13 = (long)X.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)X.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    uVar17 = uVar13;
    if (uVar13 < uVar15) {
      uVar17 = uVar15;
    }
    solution.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&vectors,uVar17 << 7,(value_type_conflict3 *)&solution,(allocator_type *)&result_1);
    result_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&solution,0x4000,(value_type_conflict3 *)&result_1,(allocator_type *)&local_3220);
    for (uVar17 = 0; uVar17 != 0x80; uVar17 = uVar17 + 1) {
      uVar21 = uVar17 - 0x40;
      if (uVar17 < 0x40) {
        uVar21 = uVar17;
      }
      for (uVar9 = 0; uVar24 = (ulong)uVar9, uVar24 < uVar15; uVar9 = uVar9 + 1) {
        pvVar25 = &work2;
        if (uVar17 < 0x40) {
          pvVar25 = &work1;
        }
        vectors.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar24 + uVar17 * uVar15] =
             ((pvVar25->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar24] >> (uVar21 & 0x3f) & 1) != 0;
      }
      *(undefined1 *)
       (CONCAT71(solution.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._1_7_,
                 solution.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_1_) + uVar17 * 0x81) = 1;
    }
    uVar17 = 0;
    uVar9 = 0;
LAB_00107486:
    uVar21 = (ulong)uVar9;
    uVar19 = (uint)uVar17;
    puVar27 = vectors.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (uVar15 <= uVar21) {
      for (; puVar27 !=
             vectors.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish; puVar27 = puVar27 + 1) {
        *puVar27 = '\0';
      }
      for (; uVar17 < 0x80; uVar17 = uVar17 + 1) {
        for (uVar15 = 0; uVar15 != 0x80; uVar15 = uVar15 + 1) {
          if (*(char *)(uVar17 * 0x80 +
                       CONCAT71(solution.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._1_7_,
                                solution.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar15) != '\0') {
            uVar21 = uVar15 - 0x40;
            if (uVar15 < 0x40) {
              uVar21 = uVar15;
            }
            for (uVar9 = 0; uVar24 = (ulong)uVar9, uVar24 < uVar13; uVar9 = uVar9 + 1) {
              p_Var30 = &local_31c8;
              if (uVar15 < 0x40) {
                p_Var30 = &X.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
              }
              vectors.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar24 + uVar17 * uVar13] =
                   vectors.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar24 + uVar17 * uVar13] ^
                   ((p_Var30->_M_impl).super__Vector_impl_data._M_start[uVar24] >> (uVar21 & 0x3f) &
                   1) != 0;
            }
          }
        }
      }
      local_3220 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&result_1,uVar13,&local_3220,&local_32a1);
      lVar18 = 0;
      uVar9 = 0;
      do {
        if (lVar18 == 0x80) {
          poVar12 = std::operator<<((ostream *)&std::cout,"Returning ");
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
          poVar12 = std::operator<<(poVar12," of ");
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
          poVar12 = std::operator<<(poVar12," non-zero nullspace vectors retrieved within ");
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
          poVar12 = std::operator<<(poVar12," candidates.");
          std::endl<char,std::char_traits<char>>(poVar12);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3160,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &result_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&result_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&solution.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&vectors.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          __blanczos_matrix::sparse::multiply_regular
                    (&matrix,&work1,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3160,nthreads);
          puVar16 = work1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          while (puVar16 !=
                 work1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
            uVar6 = *puVar16;
            puVar16 = puVar16 + 1;
            if (uVar6 != 0) {
              poVar12 = std::operator<<((ostream *)&std::cerr,"The nullspace is incorrect.");
              std::endl<char,std::char_traits<char>>(poVar12);
              iVar8 = 0xd;
              goto LAB_0010791b;
            }
          }
          for (uVar17 = 0; uVar11 != uVar17; uVar17 = uVar17 + 1) {
            if ((ulong)matrix.colmap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17] == 0xffffffff) {
              uVar23 = 0;
            }
            else {
              uVar23 = local_3160._M_impl.super__Vector_impl_data._M_start
                       [matrix.colmap.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar17]];
            }
            result[uVar17] = uVar23;
          }
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&local_3160);
          goto LAB_00107837;
        }
        uVar17 = 0;
        do {
          if (uVar13 <= uVar17) goto LAB_001076e8;
          lVar20 = uVar17 + lVar18 * uVar13;
          uVar17 = (ulong)((int)uVar17 + 1);
        } while (vectors.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar20] == '\0');
        if (uVar9 < 0x40) {
          for (uVar19 = 0; uVar17 = (ulong)uVar19, uVar17 < uVar13; uVar19 = uVar19 + 1) {
            puVar2 = (ulong *)(CONCAT71(result_1.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                        result_1.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                              uVar17 * 8);
            *puVar2 = *puVar2 | (ulong)vectors.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [uVar17 + lVar18 * uVar13] << ((ulong)uVar9 & 0x3f);
          }
          uVar9 = uVar9 + 1;
        }
LAB_001076e8:
        lVar18 = lVar18 + 1;
      } while( true );
    }
    uVar24 = 0x80;
    if (0x80 < uVar17) {
      uVar24 = uVar17;
    }
    lVar18 = uVar15 * uVar17;
    puVar27 = vectors.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start + uVar21 + lVar18;
    for (uVar22 = uVar17; uVar22 < 0x80; uVar22 = uVar22 + 1) {
      if (*puVar27 != '\0') goto LAB_001074d8;
      puVar27 = puVar27 + uVar15;
    }
    uVar22 = uVar24;
    if (0x80 < uVar19) goto LAB_001074d8;
    goto LAB_001074d1;
  }
  poVar12 = std::operator<<((ostream *)&std::cerr,"X should have size matrix.Kcol().");
  std::endl<char,std::char_traits<char>>(poVar12);
  iVar8 = 0xb;
  goto LAB_0010791b;
code_r0x00106d80:
  plVar3 = (long *)((long)T0._M_elems + lVar18);
  lVar18 = lVar18 + 8;
  if (*plVar3 != 0) goto LAB_00106d8f;
  goto LAB_00106d74;
LAB_00106d8f:
  poVar12 = std::operator<<((ostream *)&std::cout,"Lanczos iteration ");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::endl<char,std::char_traits<char>>(poVar12);
  uVar9 = 0x3f;
  uVar19 = 0;
  for (uVar13 = 0; uVar13 != 0x40; uVar13 = uVar13 + 1) {
    bVar33 = (1L << (uVar13 & 0x3f) & uVar17) == 0;
    uVar26 = uVar19;
    if (!bVar33) {
      uVar26 = uVar9;
    }
    uVar9 = uVar9 - !bVar33;
    uVar19 = uVar19 + bVar33;
    temp._M_elems[uVar26] = (uint)uVar13;
  }
  memcpy(&D,&T0,0x200);
  for (uVar13 = 0; uVar13 != 0x40; uVar13 = uVar13 + 1) {
    W0i._M_elems[uVar13] = 1L << (uVar13 & 0x3f);
  }
  puVar14 = temp._M_elems;
  uVar13 = 0;
  for (lVar18 = 0; lVar18 != 0x40; lVar18 = lVar18 + 1) {
    lVar20 = 0;
LAB_00106e46:
    if (lVar18 + lVar20 == 0x40) {
      uVar15 = (ulong)temp._M_elems[lVar18];
      uVar21 = 1L << (uVar15 & 0x3f);
      lVar20 = 0;
      while ((lVar18 + lVar20 != 0x40 && ((W0i._M_elems[puVar14[lVar20]] & uVar21) == 0))) {
        lVar20 = lVar20 + 1;
      }
      if (lVar20 != 0) {
        uVar9 = puVar14[lVar20];
        uVar6 = D._M_elems[uVar15];
        D._M_elems[uVar15] = D._M_elems[uVar9];
        D._M_elems[uVar9] = uVar6;
        uVar6 = W0i._M_elems[uVar15];
        W0i._M_elems[uVar15] = W0i._M_elems[uVar9];
        W0i._M_elems[uVar9] = uVar6;
      }
      for (uVar24 = 0; uVar24 != 0x40; uVar24 = uVar24 + 1) {
        if ((uVar15 != uVar24) && (uVar22 = W0i._M_elems[uVar24], (uVar22 & uVar21) != 0)) {
          D._M_elems[uVar24] = D._M_elems[uVar24] ^ D._M_elems[uVar15];
          W0i._M_elems[uVar24] = uVar22 ^ W0i._M_elems[uVar15];
        }
      }
      D._M_elems[uVar15] = 0;
      W0i._M_elems[uVar15] = 0;
    }
    else {
      uVar15 = (ulong)temp._M_elems[lVar18];
      if ((D._M_elems[puVar14[lVar20]] >> (uVar15 & 0x3f) & 1) == 0) goto code_r0x00106e6c;
      if (lVar20 != 0) {
        uVar9 = puVar14[lVar20];
        uVar6 = D._M_elems[uVar15];
        D._M_elems[uVar15] = D._M_elems[uVar9];
        D._M_elems[uVar9] = uVar6;
        uVar6 = W0i._M_elems[uVar15];
        W0i._M_elems[uVar15] = W0i._M_elems[uVar9];
        W0i._M_elems[uVar9] = uVar6;
      }
      uVar21 = 1L << (uVar15 & 0x3f);
      for (uVar24 = 0; uVar24 != 0x40; uVar24 = uVar24 + 1) {
        if ((uVar15 != uVar24) && ((D._M_elems[uVar24] & uVar21) != 0)) {
          D._M_elems[uVar24] = D._M_elems[uVar24] ^ D._M_elems[uVar15];
          W0i._M_elems[uVar24] = W0i._M_elems[uVar24] ^ W0i._M_elems[uVar15];
        }
      }
      uVar13 = uVar13 | uVar21;
    }
    puVar14 = puVar14 + 1;
  }
  for (uVar15 = 0; uVar15 != 0x40; uVar15 = uVar15 + 1) {
    if ((uVar13 >> (uVar15 & 0x3f) & 1) == 0) {
      W0i._M_elems[uVar15] = 0;
    }
  }
  for (lVar18 = 0; lVar18 != 0x200; lVar18 = lVar18 + 8) {
    puVar2 = (ulong *)((long)W0i._M_elems + lVar18);
    *puVar2 = *puVar2 & uVar13;
  }
  if ((uVar17 | uVar13) != 0xffffffffffffffff) {
    puVar16 = local_3258._M_impl.super__Vector_impl_data._M_start;
    do {
      if (puVar16 == local_3258._M_impl.super__Vector_impl_data._M_finish) goto LAB_0010703b;
      uVar15 = *puVar16;
      puVar16 = puVar16 + 1;
    } while ((uVar15 & ~(uVar17 | uVar13)) == 0);
    uVar9 = 0xffffffff;
LAB_00107837:
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&work2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&work1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&workV.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_3238);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&AV0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_3218);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_3258);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_31c8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&Q.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    if (uVar9 == 0xffffffff) {
      poVar12 = std::operator<<((ostream *)&std::cout,"Need to restart Lanczos.");
      std::endl<char,std::char_traits<char>>(poVar12);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&X.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::random_device::~random_device(&rd);
    goto LAB_001069e8;
  }
LAB_00107056:
  anon_unknown.dwarf_9997::dot((vec64 *)&local_31c8,&Q,&D);
  (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>(&W0i,&D,&E);
  (anonymous_namespace)::mul<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_31c8,&E,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3238);
  (anonymous_namespace)::rox<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &X.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3238,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &X.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>(&T1,&W1i,&D);
  anon_unknown.dwarf_9997::plus1(&D);
  (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>(&W2i,&D,&E);
  (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>(&E,&G,&F);
  for (lVar18 = 0; lVar18 != 0x200; lVar18 = lVar18 + 8) {
    puVar2 = (ulong *)((long)F._M_elems + lVar18);
    *puVar2 = *puVar2 & uVar13;
  }
  (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>(&W1i,&T0,&E);
  for (lVar18 = 0; lVar18 != 0x200; lVar18 = lVar18 + 8) {
    puVar2 = (ulong *)((long)E._M_elems + lVar18);
    *puVar2 = *puVar2 & uVar13;
  }
  anon_unknown.dwarf_9997::dot(&AV0,&AV0,&D);
  for (lVar18 = 0; lVar18 != 0x200; lVar18 = lVar18 + 8) {
    puVar2 = (ulong *)((long)D._M_elems + lVar18);
    *puVar2 = *puVar2 & uVar13;
  }
  for (lVar18 = 0; lVar18 != 0x40; lVar18 = lVar18 + 1) {
    G._M_elems[lVar18] = T0._M_elems[lVar18] ^ D._M_elems[lVar18];
  }
  (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>(&W0i,&G,&D);
  anon_unknown.dwarf_9997::plus1(&D);
  for (puVar16 = AV0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      puVar16 !=
      AV0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish; puVar16 = puVar16 + 1) {
    *puVar16 = *puVar16 & uVar13;
  }
  (anonymous_namespace)::mul<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_31c8,&D,&workV);
  (anonymous_namespace)::rox<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            (&AV0,&workV,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3238);
  (anonymous_namespace)::mul<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3258,&E,&workV);
  (anonymous_namespace)::rox<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3238,&workV,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3238);
  (anonymous_namespace)::mul<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3218,&F,&workV);
  (anonymous_namespace)::rox<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3238,&workV,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3238);
  puVar7 = local_3218._M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar32 = local_3218._M_impl.super__Vector_impl_data._M_finish;
  puVar16 = local_3218._M_impl.super__Vector_impl_data._M_start;
  local_3218._M_impl.super__Vector_impl_data._M_finish =
       local_3258._M_impl.super__Vector_impl_data._M_finish;
  local_3218._M_impl.super__Vector_impl_data._M_start =
       local_3258._M_impl.super__Vector_impl_data._M_start;
  local_3218._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_3258._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3258._M_impl.super__Vector_impl_data._M_start =
       local_31c8._M_impl.super__Vector_impl_data._M_start;
  local_3258._M_impl.super__Vector_impl_data._M_finish =
       local_31c8._M_impl.super__Vector_impl_data._M_finish;
  local_3258._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_31c8._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_31c8._M_impl.super__Vector_impl_data._M_start =
       local_3238._M_impl.super__Vector_impl_data._M_start;
  local_31c8._M_impl.super__Vector_impl_data._M_finish =
       local_3238._M_impl.super__Vector_impl_data._M_finish;
  local_31c8._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_3238._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3238._M_impl.super__Vector_impl_data._M_start = puVar16;
  local_3238._M_impl.super__Vector_impl_data._M_finish = puVar32;
  local_3238._M_impl.super__Vector_impl_data._M_end_of_storage = puVar7;
  __blanczos_matrix::sparse::multiply_regular
            (&matrix,&work1,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_31c8,
             nthreads);
  __blanczos_matrix::sparse::multiply_transpose(&matrix,&AV0,&work1,nthreads);
  std::array<unsigned_long,_64UL>::swap(&W2i,&W1i);
  std::array<unsigned_long,_64UL>::swap(&W1i,&W0i);
  std::array<unsigned_long,_64UL>::swap(&T1,&T0);
  anon_unknown.dwarf_9997::dot((vec64 *)&local_31c8,&AV0,&T0);
  uVar17 = uVar13;
  goto LAB_00106d72;
code_r0x00106e6c:
  lVar20 = lVar20 + 1;
  goto LAB_00106e46;
LAB_0010703b:
  poVar12 = std::operator<<((ostream *)&std::cout,
                            "Not all indices in S[i] U S[i-1], but V[i-1] zero for those indices.");
  std::endl<char,std::char_traits<char>>(poVar12);
  goto LAB_00107056;
LAB_001074d8:
  if (uVar19 == (uint)uVar22) {
    uVar24 = (ulong)(uVar19 << 7);
  }
  else {
    for (uVar26 = uVar9; uVar17 = (ulong)uVar26, uVar17 < uVar15; uVar26 = uVar26 + 1) {
      uVar4 = vectors.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17 + lVar18];
      vectors.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar17 + lVar18] =
           vectors.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[uVar17 + uVar22 * uVar15];
      vectors.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar17 + uVar22 * uVar15] = uVar4;
    }
    uVar24 = (ulong)(uVar19 << 7);
    for (lVar20 = 0; lVar20 != 0x80; lVar20 = lVar20 + 1) {
      lVar28 = CONCAT71(solution.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._1_7_,
                        solution.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar24;
      lVar29 = CONCAT71(solution.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._1_7_,
                        solution.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_1_) + (ulong)((uint)uVar22 << 7)
      ;
      uVar5 = *(undefined1 *)(lVar20 + lVar28);
      *(undefined1 *)(lVar20 + lVar28) = *(undefined1 *)(lVar20 + lVar29);
      *(undefined1 *)(lVar20 + lVar29) = uVar5;
    }
  }
  uVar17 = (ulong)(uVar19 + 1);
  lVar20 = uVar17 << 7;
  for (uVar22 = uVar17; uVar22 < 0x80; uVar22 = uVar22 + 1) {
    uVar19 = uVar9;
    if (vectors.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar21 + uVar22 * uVar15] != '\0') {
      for (; uVar31 = (ulong)uVar19, uVar31 < uVar15; uVar19 = uVar19 + 1) {
        vectors.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar31 + uVar22 * uVar15] =
             vectors.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start[uVar31 + uVar22 * uVar15] ^
             vectors.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start[uVar31 + lVar18];
      }
      for (lVar28 = 0; lVar28 != 0x80; lVar28 = lVar28 + 1) {
        pbVar1 = (byte *)(lVar28 + CONCAT71(solution.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                            solution.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                   lVar20);
        *pbVar1 = *pbVar1 ^ *(byte *)(lVar28 + CONCAT71(solution.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  solution.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                               uVar24);
      }
    }
    lVar20 = lVar20 + 0x80;
  }
LAB_001074d1:
  uVar9 = uVar9 + 1;
  goto LAB_00107486;
}

Assistant:

uint32_t blanczos(const uint32_t * B, const uint64_t N, const uint32_t Nrow, const uint32_t Ncol, uint64_t * result)
{
    const uint32_t nthreads = std::max(1U, std::thread::hardware_concurrency());
    constexpr double cache = 512.0 * 1024.0; // Blocks capped at 512 KB.

    if (Ncol < Nrow + 64U)
    {
        std::cerr << "Ncol >= Nrow + 64 is expected." << std::endl;
        exit(17);
    }

    const __blanczos_matrix::sparse matrix = __blanczos_matrix::sparse(B, N, Nrow, Ncol, cache);

    uint32_t Nsol = UINT32_MAX;
    while (Nsol == UINT32_MAX)
    {
        std::random_device rd;
        std::mt19937_64 gen(rd());
        std::uniform_int_distribution<uint64_t> dis(0U, UINT64_MAX);

        vec64 X = vec64(matrix.Kcol(), 0U);
        for (uint64_t & elem : X)
            elem = dis(gen);

        Nsol = runner(matrix, X, result, nthreads);
        if (Nsol == UINT32_MAX)
            std::cout << "Need to restart Lanczos." << std::endl;
    }
    return Nsol;
}